

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flagser.h
# Opt level: O0

vector<float,_std::allocator<float>_> *
split<float>(string *s,char delim,
            function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *transform)

{
  undefined1 uVar1;
  _Ios_Openmode _Var2;
  function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *this;
  vector<float,_std::allocator<float>_> *in_RCX;
  char in_DL;
  string *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  string item;
  stringstream ss;
  vector<float,_std::allocator<float>_> *elems;
  undefined4 in_stack_fffffffffffffdb8;
  vector<float,_std::allocator<float>_> *this_00;
  undefined7 in_stack_fffffffffffffdc8;
  string local_208 [36];
  float local_1e4;
  string local_1e0 [48];
  stringstream local_1b0 [399];
  byte local_21;
  vector<float,_std::allocator<float>_> *local_20;
  char local_11;
  string *local_10;
  
  local_21 = 0;
  local_20 = in_RCX;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x14c682);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b0,local_10,_Var2);
  std::__cxx11::string::string(local_1e0);
  while( true ) {
    this = (function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_1b0,local_1e0,local_11);
    uVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&(this->super__Function_base)._M_functor +
                              *(long *)(*(long *)&(this->super__Function_base)._M_functor + -0x18)))
    ;
    if (!(bool)uVar1) break;
    this_00 = local_20;
    std::__cxx11::string::string(local_208,local_1e0);
    local_1e4 = std::
                function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                ::operator()(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar1,in_stack_fffffffffffffdc8));
    std::vector<float,_std::allocator<float>_>::push_back
              (this_00,(value_type_conflict1 *)CONCAT44(local_1e4,in_stack_fffffffffffffdb8));
    std::__cxx11::string::~string(local_208);
  }
  local_21 = 1;
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  if ((local_21 & 1) == 0) {
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)this);
  }
  return in_RDI;
}

Assistant:

std::vector<t> split(const std::string& s, char delim, const std::function<t(std::string)>& transform) {
	std::vector<t> elems;
	std::stringstream ss(s);
	std::string item;
	while (std::getline(ss, item, delim)) elems.push_back(transform(item));
	return elems;
}